

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assign.h
# Opt level: O0

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0,_0,_0>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,
          Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src)

{
  Index IVar1;
  Index IVar2;
  undefined8 local_38;
  Index inner;
  Index outer;
  Index outerSize;
  Index innerSize;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  IVar1 = DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::innerSize
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  IVar2 = DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::outerSize
                    ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  for (inner = 0; inner < IVar2; inner = inner + 1) {
    for (local_38 = 0; local_38 < IVar1; local_38 = local_38 + 1) {
      DenseCoeffsBase<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
      copyCoeffByOuterInner<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((DenseCoeffsBase<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)dst,inner,local_38,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)src);
    }
  }
  return;
}

Assistant:

static inline void run(Derived1 &dst, const Derived2 &src)
  {
    const Index innerSize = dst.innerSize();
    const Index outerSize = dst.outerSize();
    for(Index outer = 0; outer < outerSize; ++outer)
      for(Index inner = 0; inner < innerSize; ++inner)
        dst.copyCoeffByOuterInner(outer, inner, src);
  }